

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

void Pla_ManConvertToBits(Pla_Man_t *p)

{
  int iVar1;
  int i_00;
  Vec_Int_t *p_00;
  word *p_01;
  Pla_Lit_t d;
  int local_20;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  Pla_Man_t *p_local;
  
  iVar1 = Vec_WecSize(&p->vCubeLits);
  Vec_IntFillNatural(&p->vCubes,iVar1);
  iVar1 = Pla_ManCubeNum(p);
  Vec_WrdFill(&p->vInBits,iVar1 * p->nInWords,0);
  for (Lit = 0; iVar1 = Vec_WecSize(&p->vCubeLits), Lit < iVar1; Lit = Lit + 1) {
    p_00 = Vec_WecEntry(&p->vCubeLits,Lit);
    for (local_20 = 0; iVar1 = Vec_IntSize(p_00), local_20 < iVar1; local_20 = local_20 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_20);
      p_01 = Pla_CubeIn(p,Lit);
      i_00 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitIsCompl(iVar1);
      d = PLA_LIT_ONE;
      if (iVar1 != 0) {
        d = PLA_LIT_ZERO;
      }
      Pla_CubeSetLit(p_01,i_00,d);
    }
  }
  return;
}

Assistant:

void Pla_ManConvertToBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube; int i, k, Lit;
    Vec_IntFillNatural( &p->vCubes, Vec_WecSize(&p->vCubeLits) );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        Vec_IntForEachEntry( vCube, Lit, k )
            Pla_CubeSetLit( Pla_CubeIn(p, i), Abc_Lit2Var(Lit), Abc_LitIsCompl(Lit) ? PLA_LIT_ZERO : PLA_LIT_ONE );
}